

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_intervals.h
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
Gudhi::Persistence_representations::Persistence_intervals::
cumulative_characteristic_function_of_diagram
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          Persistence_intervals *this,double x_min,double x_max,size_t number_of_bins)

{
  pointer pdVar1;
  long lVar2;
  double dVar3;
  vector<double,_std::allocator<double>_> intsOfBars;
  allocator_type local_29;
  vector<double,_std::allocator<double>_> local_28;
  
  characteristic_function_of_diagram(&local_28,this,x_min,x_max,number_of_bins);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,
             (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_29);
  if ((long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == (pointer)0x0) {
      return __return_storage_ptr__;
    }
  }
  else {
    pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar3 = 0.0;
    lVar2 = 0;
    do {
      dVar3 = dVar3 + local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar2];
      pdVar1[lVar2] = dVar3;
      lVar2 = lVar2 + 1;
    } while ((long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3 != lVar2);
  }
  operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> Persistence_intervals::cumulative_characteristic_function_of_diagram(double x_min, double x_max,
                                                                                         size_t number_of_bins) const {
  std::vector<double> intsOfBars = this->characteristic_function_of_diagram(x_min, x_max, number_of_bins);
  std::vector<double> result(intsOfBars.size());
  double sum = 0;
  for (size_t i = 0; i != intsOfBars.size(); ++i) {
    sum += intsOfBars[i];
    result[i] = sum;
  }
  return result;
}